

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseCheckNondrivenNets(Vec_Ptr_t *vUndefs)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  char *pcVar5;
  int i;
  int i_00;
  int i_01;
  int i_02;
  
  i_00 = 0;
  do {
    if (vUndefs->nSize <= i_00) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(vUndefs,i_00);
    for (i = 0; i < (*(Vec_Ptr_t **)((long)pvVar2 + 0x158))->nSize; i = i + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x158),i);
      i_02 = *(int *)(*(long *)((long)pvVar3 + 0x40) + 4);
      while (0 < i_02) {
        i_02 = i_02 + -1;
        pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x40),i_02);
        if (pvVar4 != (void *)0x0) {
          for (i_01 = 0; i_01 < (*(Vec_Ptr_t **)((long)pvVar4 + 8))->nSize; i_01 = i_01 + 1) {
            pObj = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar4 + 8),i_01);
            if ((pObj->vFanins).nSize == 0) {
              pcVar5 = Abc_ObjName(pObj);
              iVar1 = strcmp(pcVar5,"1\'b0");
              if (iVar1 != 0) {
                pcVar5 = Abc_ObjName(pObj);
                iVar1 = strcmp(pcVar5,"1\'b1");
                if (iVar1 != 0) {
                  return 1;
                }
              }
            }
          }
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

int Ver_ParseCheckNondrivenNets( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int i, k, j, m;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // go through the bundles of this instance
            Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
                // go through the actual nets of this bundle
                if ( pBundle )
                Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
                {
                    if ( Abc_ObjFaninNum(pNet) == 0 ) // non-driven
                        if ( strcmp(Abc_ObjName(pNet), "1\'b0") && strcmp(Abc_ObjName(pNet), "1\'b1") ) // diff from a const
                            return 1;
                }
    return 0;
}